

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

RESULT_TYPE __thiscall
duckdb::QuantileComposed<duckdb::MadAccessor<short,_short,_short>,_duckdb::QuantileIndirect<short>_>
::operator()(QuantileComposed<duckdb::MadAccessor<short,_short,_short>,_duckdb::QuantileIndirect<short>_>
             *this,idx_t *input)

{
  DataChunk *result;
  MadAccessor<short,_short,_short> *pMVar1;
  CURSOR *pCVar2;
  ulong seek_idx;
  short sVar3;
  reference pvVar4;
  ulong uVar5;
  OutOfRangeException *this_00;
  short sVar6;
  string local_48;
  
  pMVar1 = this->outer;
  pCVar2 = this->inner->data;
  seek_idx = *input;
  uVar5 = (pCVar2->scan).current_row_index;
  if ((pCVar2->scan).next_row_index <= seek_idx || seek_idx < uVar5) {
    result = &pCVar2->page;
    ColumnDataCollection::Seek(pCVar2->inputs,seek_idx,&pCVar2->scan,result);
    pvVar4 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    pCVar2->data = (short *)pvVar4->data;
    pvVar4 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    FlatVector::VerifyFlatVector(pvVar4);
    pCVar2->validity = &pvVar4->validity;
    uVar5 = (pCVar2->scan).current_row_index;
  }
  sVar6 = pCVar2->data[(uint)((int)seek_idx - (int)uVar5)] - *pMVar1->median;
  if (sVar6 != -0x8000) {
    sVar3 = -sVar6;
    if (0 < sVar6) {
      sVar3 = sVar6;
    }
    return sVar3;
  }
  this_00 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Overflow on abs(%d)","");
  OutOfRangeException::OutOfRangeException<short>(this_00,&local_48,-0x8000);
  __cxa_throw(this_00,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

inline RESULT_TYPE operator()(const idx_t &input) const {
		return outer(inner(input));
	}